

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O2

void add_weapon_skill(int n)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = 0;
  for (iVar2 = 0; iVar2 != 0x2a; iVar2 = iVar2 + 1) {
    bVar1 = can_advance(iVar2,'\0');
    uVar4 = uVar4 + bVar1;
  }
  u.weapon_slots = u.weapon_slots + n;
  uVar3 = 0;
  for (iVar2 = 0; iVar2 != 0x2a; iVar2 = iVar2 + 1) {
    bVar1 = can_advance(iVar2,'\0');
    uVar3 = uVar3 + bVar1;
  }
  if (uVar4 < uVar3) {
    give_may_advance_msg(0);
    return;
  }
  return;
}

Assistant:

void add_weapon_skill(int n)
{
    int i, before, after;

    for (i = 0, before = 0; i < P_NUM_SKILLS; i++)
	if (can_advance(i, FALSE)) before++;
    u.weapon_slots += n;
    for (i = 0, after = 0; i < P_NUM_SKILLS; i++)
	if (can_advance(i, FALSE)) after++;
    if (before < after)
	give_may_advance_msg(P_NONE);
}